

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_editor.cpp
# Opt level: O0

int main(void)

{
  FILE *__stream;
  int fd_in;
  int fd_out;
  key_e kVar1;
  undefined8 uVar2;
  undefined1 local_40d0 [56];
  cmd_obj O_cmd;
  undefined1 local_48 [4];
  int tabs;
  editor editor;
  terminal_driver *tdriver;
  
  fd_in = fileno(_stdin);
  fd_out = fileno(_stdout);
  editor.seq_N = (size_t)libchars::terminal_driver::initialize(fd_in,fd_out);
  libchars::editor::editor((editor *)local_48,(terminal_driver *)editor.seq_N);
  O_cmd.super_edit_object.prompt_rendered._4_4_ = 0;
  cmd_obj::cmd_obj((cmd_obj *)(local_40d0 + 0x30),"hello");
  std::__cxx11::string::operator=((string *)&O_cmd.super_edit_object.mode,"PROMPT:");
  while( true ) {
    while( true ) {
      libchars::editor::edit((edit_object *)local_48,(ulong)(local_40d0 + 0x30));
      kVar1 = libchars::editor::key((editor *)local_48);
      __stream = _stdout;
      if (kVar1 != KEY_TAB) break;
      O_cmd.super_edit_object.prompt_rendered._4_4_ =
           O_cmd.super_edit_object.prompt_rendered._4_4_ + 1;
      if (2 < O_cmd.super_edit_object.prompt_rendered._4_4_) {
        fprintf(_stdout,"\n[COMPLETE]\n");
        goto LAB_001034be;
      }
      libchars::edit_object::insert((edit_object *)(local_40d0 + 0x30),'X');
    }
    if (kVar1 == KEY_ENTER) break;
    if (kVar1 != KEY_HELP) {
      fprintf(_stdout,"\n[TERMINATE]\n");
LAB_001034be:
      cmd_obj::~cmd_obj((cmd_obj *)(local_40d0 + 0x30));
      return 0;
    }
  }
  cmd_obj::value_abi_cxx11_((cmd_obj *)local_40d0);
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"\n%s\n",uVar2);
  std::__cxx11::string::~string((string *)local_40d0);
  goto LAB_001034be;
}

Assistant:

int main(void)
{
    libchars::terminal_driver &tdriver = libchars::terminal_driver::initialize();
    libchars::editor editor(tdriver);

    int tabs = 0;
    cmd_obj O_cmd("hello");
    O_cmd.prompt = "PROMPT:";

    while (true) {
        (void)editor.edit(O_cmd);
        switch (editor.key()) {
        case libchars::KEY_ENTER:
            fprintf(stdout,"\n%s\n",O_cmd.value().c_str());
            return 0;
        case libchars::KEY_TAB:
            if (++tabs > 2) {
                fprintf(stdout,"\n[COMPLETE]\n");
                return 0;
            }
            else {
                O_cmd.insert('X');
            }
            break;
        case libchars::KEY_HELP:
            //ignore
            break;
        default:
            fprintf(stdout,"\n[TERMINATE]\n");
            return 0;
        }
    }

    return 0;
}